

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_int16 *
ma_dr_flac__full_read_and_close_s16
          (ma_dr_flac *pFlac,uint *channelsOut,uint *sampleRateOut,ma_uint64 *totalPCMFrameCountOut)

{
  ma_uint64 mVar1;
  void *pvVar2;
  void *szOld;
  ma_uint64 *in_RCX;
  undefined4 *in_RDX;
  uint *in_RSI;
  long in_RDI;
  ma_uint64 dataSize;
  size_t newSampleDataBufferSize;
  ma_int16 *pNewSampleData;
  size_t sampleDataBufferSize;
  ma_uint64 pcmFramesRead;
  ma_int16 buffer [4096];
  ma_uint64 totalPCMFrameCount;
  ma_int16 *pSampleData;
  ma_allocation_callbacks *in_stack_ffffffffffffdf98;
  ma_dr_flac *in_stack_ffffffffffffdfa0;
  ma_int16 *in_stack_ffffffffffffdfb0;
  void *p;
  undefined1 local_2038 [24];
  ma_int16 *in_stack_ffffffffffffdfe0;
  ma_uint64 in_stack_ffffffffffffdfe8;
  ma_dr_flac *in_stack_ffffffffffffdff0;
  ma_uint64 local_38;
  ma_int16 *local_30;
  
  if (*(long *)(in_RDI + 0x38) == 0) {
    p = (void *)0x2000;
    local_30 = (ma_int16 *)
               ma_dr_flac__malloc_from_callbacks
                         ((size_t)in_stack_ffffffffffffdf98,(ma_allocation_callbacks *)0x200695);
    if (local_30 != (ma_int16 *)0x0) {
      local_38 = 0;
      while (mVar1 = ma_dr_flac_read_pcm_frames_s16
                               (in_stack_ffffffffffffdff0,in_stack_ffffffffffffdfe8,
                                in_stack_ffffffffffffdfe0), mVar1 != 0) {
        pvVar2 = (void *)((local_38 + mVar1) * (ulong)*(byte *)(in_RDI + 0x34) * 2);
        szOld = p;
        if (p <= pvVar2 && (long)pvVar2 - (long)p != 0) {
          szOld = (void *)((long)p << 1);
          in_stack_ffffffffffffdfb0 =
               (ma_int16 *)
               ma_dr_flac__realloc_from_callbacks
                         (p,(size_t)in_stack_ffffffffffffdfb0,(size_t)szOld,
                          (ma_allocation_callbacks *)in_stack_ffffffffffffdfa0);
          local_30 = in_stack_ffffffffffffdfb0;
          if (in_stack_ffffffffffffdfb0 == (ma_int16 *)0x0) {
            ma_dr_flac__free_from_callbacks(in_stack_ffffffffffffdfa0,in_stack_ffffffffffffdf98);
            goto LAB_0020093d;
          }
        }
        memcpy(local_30 + local_38 * *(byte *)(in_RDI + 0x34),local_2038,
               mVar1 * *(byte *)(in_RDI + 0x34) * 2);
        local_38 = mVar1 + local_38;
        p = szOld;
      }
      memset(local_30 + local_38 * *(byte *)(in_RDI + 0x34),0,
             (size_t)((long)p + local_38 * *(byte *)(in_RDI + 0x34) * -2));
LAB_002008bf:
      if (in_RDX != (undefined4 *)0x0) {
        *in_RDX = *(undefined4 *)(in_RDI + 0x30);
      }
      if (in_RSI != (uint *)0x0) {
        *in_RSI = (uint)*(byte *)(in_RDI + 0x34);
      }
      if (in_RCX != (ma_uint64 *)0x0) {
        *in_RCX = local_38;
      }
      ma_dr_flac_close(in_stack_ffffffffffffdfa0);
      return local_30;
    }
  }
  else {
    in_stack_ffffffffffffdfa0 =
         (ma_dr_flac *)(*(long *)(in_RDI + 0x38) * (ulong)*(byte *)(in_RDI + 0x34) * 2);
    local_30 = (ma_int16 *)
               ma_dr_flac__malloc_from_callbacks
                         ((size_t)in_stack_ffffffffffffdf98,(ma_allocation_callbacks *)0x20087e);
    if (local_30 != (ma_int16 *)0x0) {
      local_38 = ma_dr_flac_read_pcm_frames_s16
                           (in_stack_ffffffffffffdff0,in_stack_ffffffffffffdfe8,
                            in_stack_ffffffffffffdfe0);
      goto LAB_002008bf;
    }
  }
LAB_0020093d:
  ma_dr_flac_close(in_stack_ffffffffffffdfa0);
  return (ma_int16 *)0x0;
}

Assistant:

ma_int32* ma_dr_flac_open_and_read_pcm_frames_s32(ma_dr_flac_read_proc onRead, ma_dr_flac_seek_proc onSeek, void* pUserData, unsigned int* channelsOut, unsigned int* sampleRateOut, ma_uint64* totalPCMFrameCountOut, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_dr_flac* pFlac;
    if (channelsOut) {
        *channelsOut = 0;
    }
    if (sampleRateOut) {
        *sampleRateOut = 0;
    }
    if (totalPCMFrameCountOut) {
        *totalPCMFrameCountOut = 0;
    }
    pFlac = ma_dr_flac_open(onRead, onSeek, pUserData, pAllocationCallbacks);
    if (pFlac == NULL) {
        return NULL;
    }
    return ma_dr_flac__full_read_and_close_s32(pFlac, channelsOut, sampleRateOut, totalPCMFrameCountOut);
}